

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_huffman_codes.cpp
# Opt level: O3

int __thiscall lzham::code_size_histogram::init(code_size_histogram *this,EVP_PKEY_CTX *ctx)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  ulong in_RAX;
  uint8 *p;
  byte *in_RDX;
  
  if (3 < (uint)ctx) {
    in_RAX = (ulong)ctx >> 2 & 0x3fffffff;
    do {
      bVar1 = in_RDX[1];
      bVar2 = in_RDX[2];
      bVar3 = in_RDX[3];
      this->m_num_codes[*in_RDX] = this->m_num_codes[*in_RDX] + 1;
      this->m_num_codes[bVar1] = this->m_num_codes[bVar1] + 1;
      this->m_num_codes[bVar2] = this->m_num_codes[bVar2] + 1;
      this->m_num_codes[bVar3] = this->m_num_codes[bVar3] + 1;
      in_RDX = in_RDX + 4;
      uVar4 = (int)in_RAX - 1;
      in_RAX = (ulong)uVar4;
    } while (uVar4 != 0);
  }
  if (((ulong)ctx & 3) != 0) {
    in_RAX = 0;
    do {
      this->m_num_codes[in_RDX[in_RAX]] = this->m_num_codes[in_RDX[in_RAX]] + 1;
      in_RAX = in_RAX + 1;
    } while (((uint)ctx & 3) != (uint)in_RAX);
  }
  return (int)in_RAX;
}

Assistant:

void code_size_histogram::init(uint num_syms, const uint8* pCodesizes)
   {
      const uint8 *p = pCodesizes;

      for (uint i = num_syms >> 2; i; --i)
      {
         uint a = p[0]; 
         uint b = p[1];
         uint c = p[2];
         uint d = p[3];
         m_num_codes[a]++;
         m_num_codes[b]++;
         m_num_codes[c]++;
         m_num_codes[d]++;
         p += 4;
      }

      for (uint i = num_syms & 3; i; --i)
         m_num_codes[*p++]++;

      LZHAM_ASSERT(static_cast<uint>(p - pCodesizes) == num_syms);
   }